

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

void FindFollowSets(lemon *lemp)

{
  state **ppsVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  config *pcVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  plink *ppVar11;
  long lVar12;
  bool bVar13;
  
  uVar10 = (ulong)lemp->nstate;
  if (0 < (long)uVar10) {
    ppsVar1 = lemp->sorted;
    uVar6 = 0;
    do {
      for (pcVar7 = ppsVar1[uVar6]->cfp; pcVar7 != (config *)0x0; pcVar7 = pcVar7->next) {
        pcVar7->status = INCOMPLETE;
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar10);
  }
  do {
    if ((int)uVar10 < 1) {
      return;
    }
    lVar5 = 0;
    bVar4 = false;
    do {
      pcVar7 = lemp->sorted[lVar5]->cfp;
      if (pcVar7 != (config *)0x0) {
        do {
          if (pcVar7->status != COMPLETE) {
            for (ppVar11 = pcVar7->fplp; ppVar11 != (plink *)0x0; ppVar11 = ppVar11->next) {
              lVar12 = (long)size;
              if (0 < lVar12) {
                pcVar2 = ppVar11->cfp->fws;
                pcVar3 = pcVar7->fws;
                bVar13 = true;
                lVar9 = 0;
                do {
                  while ((lVar8 = lVar9 + 1, pcVar3[lVar9] == '\0' || (pcVar2[lVar9] != '\0'))) {
                    lVar9 = lVar8;
                    if (lVar8 == lVar12) {
                      if (bVar13) goto LAB_00104e50;
                      goto LAB_00104e41;
                    }
                  }
                  pcVar2[lVar9] = '\x01';
                  bVar13 = false;
                  lVar9 = lVar8;
                } while (lVar8 != lVar12);
LAB_00104e41:
                ppVar11->cfp->status = INCOMPLETE;
                bVar4 = true;
              }
LAB_00104e50:
            }
            pcVar7->status = COMPLETE;
          }
          pcVar7 = pcVar7->next;
        } while (pcVar7 != (config *)0x0);
        uVar10 = (ulong)(uint)lemp->nstate;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < (int)uVar10);
    if (!bVar4) {
      return;
    }
  } while( true );
}

Assistant:

void FindFollowSets(struct lemon *lemp)
{
  int i;
  struct config *cfp;
  struct plink *plp;
  int progress;
  int change;

  for(i=0; i<lemp->nstate; i++){
    for(cfp=lemp->sorted[i]->cfp; cfp; cfp=cfp->next){
      cfp->status = INCOMPLETE;
    }
  }
  
  do{
    progress = 0;
    for(i=0; i<lemp->nstate; i++){
      for(cfp=lemp->sorted[i]->cfp; cfp; cfp=cfp->next){
        if( cfp->status==COMPLETE ) continue;
        for(plp=cfp->fplp; plp; plp=plp->next){
          change = SetUnion(plp->cfp->fws,cfp->fws);
          if( change ){
            plp->cfp->status = INCOMPLETE;
            progress = 1;
	  }
	}
        cfp->status = COMPLETE;
      }
    }
  }while( progress );
}